

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QByteArray,_QTzTimeZone> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_>::findNode<QByteArray>
          (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *this,QByteArray *key)

{
  long lVar1;
  bool bVar2;
  Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *in_RSI;
  long in_FS_OFFSET;
  Bucket bucket;
  QByteArray *in_stack_ffffffffffffffc8;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QByteArray>(in_RSI,in_stack_ffffffffffffffc8);
  bVar2 = Bucket::isUnused((Bucket *)0x75d85b);
  if (bVar2) {
    local_20 = (Node<QByteArray,_QTzTimeZone> *)0x0;
  }
  else {
    local_20 = Bucket::node((Bucket *)0x75d876);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }